

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFPrimitiveWriter.cpp
# Opt level: O2

EStatusCode __thiscall
CFFPrimitiveWriter::WriteCard16(CFFPrimitiveWriter *this,unsigned_short inValue)

{
  EStatusCode EVar1;
  
  EVar1 = WriteByte(this,(Byte)(inValue >> 8));
  if (EVar1 == eSuccess) {
    EVar1 = WriteByte(this,(Byte)inValue);
    EVar1 = -(uint)(EVar1 != eSuccess);
  }
  else {
    EVar1 = eFailure;
  }
  return EVar1;
}

Assistant:

EStatusCode CFFPrimitiveWriter::WriteCard16(unsigned short inValue)
{
	Byte byte1 = (inValue>>8) & 0xff;
	Byte byte2 = inValue & 0xff;
    
	if(WriteByte(byte1) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;
    
	if(WriteByte(byte2) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;
    
	return PDFHummus::eSuccess;
}